

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O3

void __thiscall helics::apps::Recorder::addEndpoint(Recorder *this,string_view endpoint)

{
  _Map_pointer ppEVar1;
  Endpoint *pEVar2;
  InterfaceVisibility IVar3;
  iterator iVar4;
  string *psVar5;
  InterfaceVisibility *pIVar6;
  Endpoint *pEVar7;
  _Elt_pointer pEVar8;
  int index;
  InterfaceHandle endpointId;
  InterfaceVisibility local_48;
  InterfaceHandle local_44;
  key_type local_40;
  key_type local_30;
  
  local_30._M_str = endpoint._M_str;
  local_30._M_len = endpoint._M_len;
  iVar4 = CLI::std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::find(&(this->eptNames)._M_t,&local_30);
  if (((_Rb_tree_header *)iVar4._M_node == &(this->eptNames)._M_t._M_impl.super__Rb_tree_header) ||
     (*(int *)&iVar4._M_node[1]._M_left == -1)) {
    local_48 = GLOBAL;
    local_40._M_len =
         (size_t)(this->super_App).fed.
                 super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::
    emplace_back<helics::InterfaceVisibility,helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&>
              ((deque<helics::Endpoint,std::allocator<helics::Endpoint>> *)&this->endpoints,
               &local_48,(CombinationFederate **)&local_40,&local_30);
    ppEVar1 = (this->endpoints).
              super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    pEVar7 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    pEVar2 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first;
    local_48 = ((int)((ulong)((long)pEVar7 - (long)pEVar2) >> 3) * -0x11111111 +
                ((int)((ulong)((long)ppEVar1 -
                              (long)(this->endpoints).
                                    super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
                (uint)(ppEVar1 == (_Map_pointer)0x0)) * 4 +
               (int)((ulong)((long)(this->endpoints).
                                   super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)(this->endpoints).
                                  super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) *
               -0x11111111) - GLOBAL;
    if (pEVar7 == pEVar2) {
      pEVar7 = ppEVar1[-1] + 4;
    }
    local_44.hid = pEVar7[-1].super_Interface.handle.hid;
    std::
    _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,int>,std::_Select1st<std::pair<helics::InterfaceHandle_const,int>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,int>>>
    ::_M_emplace_unique<helics::InterfaceHandle&,int&>
              ((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,int>,std::_Select1st<std::pair<helics::InterfaceHandle_const,int>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,int>>>
                *)&this->eptids,&local_44,(int *)&local_48);
    IVar3 = local_48;
    pEVar8 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pEVar8 == (this->endpoints).
                  super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pEVar8 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 4;
    }
    psVar5 = Interface::getName_abi_cxx11_(&pEVar8[-1].super_Interface);
    local_40._M_str = (psVar5->_M_dataplus)._M_p;
    local_40._M_len = psVar5->_M_string_length;
    pIVar6 = (InterfaceVisibility *)
             CLI::std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[](&this->eptNames,&local_40);
    *pIVar6 = IVar3;
  }
  return;
}

Assistant:

void Recorder::addEndpoint(std::string_view endpoint)
{
    auto res = eptNames.find(endpoint);
    if ((res == eptNames.end()) || (res->second == -1)) {
        endpoints.emplace_back(InterfaceVisibility::GLOBAL, fed.get(), endpoint);
        auto index = static_cast<int>(endpoints.size()) - 1;
        auto endpointId = endpoints.back().getHandle();
        eptids.emplace(endpointId, index);  // this is a new element
        eptNames[endpoints.back().getName()] = index;  // this is a potential replacement
    }
}